

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

void write1_cb(uv_write_t *req,int status)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_18 [16];
  
  if (req == (uv_write_t *)0x0) {
    pcVar5 = "!=";
    pcVar7 = "!=";
    lVar2 = 0;
    pcVar6 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar4 = "req";
    uVar3 = 0x9e;
LAB_0018d3ab:
    fprintf(_stderr,__format,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,uVar3,pcVar4,pcVar5,pcVar6,lVar2,pcVar7,0);
    abort();
  }
  if (status == 0) {
    if (shutdown_requested == 0) {
      local_18 = uv_buf_init("P",1);
      iVar1 = uv_write(&write_req,req->handle,local_18,1,write1_cb);
      lVar2 = (long)iVar1;
      if (lVar2 != 0) {
        pcVar5 = "==";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
        pcVar4 = "r";
        uVar3 = 0xa9;
        pcVar7 = "==";
        pcVar6 = "0";
        goto LAB_0018d3ab;
      }
      write_cb_called = write_cb_called + 1;
    }
  }
  else if (shutdown_cb_called == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,0xa0,"shutdown_cb_called");
    abort();
  }
  return;
}

Assistant:

static void write1_cb(uv_write_t* req, int status) {
  uv_buf_t buf;
  int r;

  ASSERT_NOT_NULL(req);
  if (status) {
    ASSERT(shutdown_cb_called);
    return;
  }

  if (shutdown_requested)
    return;

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, req->handle, &buf, 1, write1_cb);
  ASSERT_OK(r);

  write_cb_called++;
}